

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O0

string * __thiscall
sockpp::inet6_address::to_string_abi_cxx11_(string *__return_storage_ptr__,inet6_address *this)

{
  in_port_t iVar1;
  char *local_138;
  string local_110;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  char *str;
  char buf [46];
  inet6_address *this_local;
  
  unique0x10000201 = this;
  local_50 = inet_ntop(10,&(this->addr_).sin6_addr,(char *)&str,0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"[",&local_b1);
  if (local_50 == (char *)0x0) {
    local_138 = "<unknown>";
  }
  else {
    local_138 = local_50;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,local_138,&local_e9);
  std::operator+(&local_90,&local_b0,&local_e8);
  std::operator+(&local_70,&local_90,"]:");
  iVar1 = port(this);
  std::__cxx11::to_string(&local_110,(uint)iVar1);
  std::operator+(__return_storage_ptr__,&local_70,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  return __return_storage_ptr__;
}

Assistant:

string inet6_address::to_string() const {
    char buf[INET6_ADDRSTRLEN];
    auto str = inet_ntop(AF_INET6, (void*)&(addr_.sin6_addr), buf, INET6_ADDRSTRLEN);
    return string("[") + string(str ? str : "<unknown>") +
           "]:" + std::to_string(unsigned(port()));
}